

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue promise_reaction_job(JSContext *ctx,int argc,JSValue *argv)

{
  JSValueUnion *pJVar1;
  int *piVar2;
  JSRuntime *pJVar3;
  JSValue JVar4;
  int iVar5;
  ulong uVar6;
  int64_t iVar7;
  ulong uVar8;
  JSValue JVar9;
  JSValue JVar10;
  JSValue JVar11;
  JSValue arg;
  uint uStack_54;
  JSValue local_48;
  JSValueUnion local_38;
  int64_t iStack_30;
  
  iVar7 = argv[2].tag;
  JVar4 = argv[2];
  piVar2 = (int *)argv[3].u.ptr;
  JVar10 = argv[3];
  if (0xfffffff4 < (uint)argv[3].tag) {
    *piVar2 = *piVar2 + 1;
  }
  iVar5 = JS_ToBoolFree(ctx,JVar10);
  pJVar1 = &argv[4].u;
  local_38 = (JSValueUnion)pJVar1->ptr;
  iStack_30 = argv[4].tag;
  JVar9 = *(JSValue *)pJVar1;
  JVar10 = *(JSValue *)pJVar1;
  if ((int)iVar7 == 3) {
    if (iVar5 == 0) {
      local_48 = *(JSValue *)pJVar1;
      if (0xfffffff4 < (uint)iStack_30) {
        *(int *)local_38.ptr = *local_38.ptr + 1;
        local_48 = JVar9;
      }
      goto LAB_001465f5;
    }
    if (0xfffffff4 < (uint)iStack_30) {
      *(int *)local_38.ptr = *local_38.ptr + 1;
    }
    JS_Throw(ctx,JVar10);
  }
  else {
    JVar10.tag = 3;
    JVar10.u.ptr = (void *)((ulong)uStack_54 << 0x20);
    local_48 = JS_CallInternal(ctx,JVar4,(JSValue)(ZEXT816(3) << 0x40),JVar10,1,(JSValue *)&local_38
                               ,2);
LAB_001465f5:
    if ((int)local_48.tag != 6) {
      iVar5 = 0;
      goto LAB_0014663e;
    }
  }
  pJVar3 = ctx->rt;
  local_48 = pJVar3->current_exception;
  (pJVar3->current_exception).u.int32 = 0;
  (pJVar3->current_exception).tag = 2;
  iVar5 = 1;
LAB_0014663e:
  iVar7 = *(int64_t *)((long)&argv->tag + (ulong)(uint)(iVar5 << 4));
  if ((int)iVar7 == 3) {
    iVar7 = 3;
    uVar6 = 0;
    uVar8 = 0;
  }
  else {
    JVar4.tag = 3;
    JVar4.u.ptr = (void *)((ulong)uStack_54 << 0x20);
    JVar9.tag = iVar7;
    JVar9.u.ptr = ((JSValueUnion *)((long)&argv->u + (ulong)(uint)(iVar5 << 4)))->ptr;
    JVar10 = JS_CallInternal(ctx,JVar9,(JSValue)(ZEXT816(3) << 0x40),JVar4,1,&local_48,2);
    iVar7 = JVar10.tag;
    uVar8 = (ulong)JVar10.u.ptr & 0xffffffff00000000;
    uVar6 = (ulong)JVar10.u._0_4_;
  }
  if ((0xfffffff4 < (uint)local_48.tag) &&
     (iVar5 = *local_48.u.ptr, *(int *)local_48.u.ptr = iVar5 + -1, iVar5 < 2)) {
    __JS_FreeValueRT(ctx->rt,local_48);
  }
  JVar11.tag = iVar7;
  JVar11.u.ptr = (void *)(uVar8 | uVar6);
  return JVar11;
}

Assistant:

static JSValue promise_reaction_job(JSContext *ctx, int argc,
                                    JSValueConst *argv)
{
    JSValueConst handler, arg, func;
    JSValue res, res2;
    BOOL is_reject;

    assert(argc == 5);
    handler = argv[2];
    is_reject = JS_ToBool(ctx, argv[3]);
    arg = argv[4];
#ifdef DUMP_PROMISE
    printf("promise_reaction_job: is_reject=%d\n", is_reject);
#endif

    if (JS_IsUndefined(handler)) {
        if (is_reject) {
            res = JS_Throw(ctx, JS_DupValue(ctx, arg));
        } else {
            res = JS_DupValue(ctx, arg);
        }
    } else {
        res = JS_Call(ctx, handler, JS_UNDEFINED, 1, &arg);
    }
    is_reject = JS_IsException(res);
    if (is_reject)
        res = JS_GetException(ctx);
    func = argv[is_reject];
    /* as an extension, we support undefined as value to avoid
       creating a dummy promise in the 'await' implementation of async
       functions */
    if (!JS_IsUndefined(func)) {
        res2 = JS_Call(ctx, func, JS_UNDEFINED,
                       1, (JSValueConst *)&res);
    } else {
        res2 = JS_UNDEFINED;
    }
    JS_FreeValue(ctx, res);

    return res2;
}